

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O0

void do_combine(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var2;
  char *unaff_retaddr;
  
  uVar1 = in_RDI->comm[0];
  _Var2 = std::pow<int,int>(0,0x54644d);
  if ((uVar1 & (long)_Var2) == 0) {
    send_to_char(unaff_retaddr,in_RDI);
    _Var2 = std::pow<int,int>(0,0x5464bd);
    in_RDI->comm[0] = (long)_Var2 | in_RDI->comm[0];
  }
  else {
    send_to_char(unaff_retaddr,in_RDI);
    _Var2 = std::pow<int,int>(0,0x54647f);
    in_RDI->comm[0] = ((long)_Var2 ^ 0xffffffffffffffffU) & in_RDI->comm[0];
  }
  return;
}

Assistant:

void do_combine(CHAR_DATA *ch, char *argument)
{
	if (IS_SET(ch->comm, COMM_COMBINE))
	{
		send_to_char("Long inventory selected.\n\r", ch);
		REMOVE_BIT(ch->comm, COMM_COMBINE);
	}
	else
	{
		send_to_char("Combined inventory selected.\n\r", ch);
		SET_BIT(ch->comm, COMM_COMBINE);
	}
}